

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

int ARKStepResVtolerance(void *arkode_mem,N_Vector rabstol)

{
  ARKodeMem in_RSI;
  N_Vector in_RDI;
  ARKodeMem ark_mem;
  int local_4;
  
  if (in_RDI == (N_Vector)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::ARKStep","ARKStepResVtolerance",
                    "arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    local_4 = arkResVtolerance(in_RSI,in_RDI);
  }
  return local_4;
}

Assistant:

int ARKStepResVtolerance(void *arkode_mem, N_Vector rabstol)
{
  /* unpack ark_mem, call arkResVtolerance, and return */
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::ARKStep",
                    "ARKStepResVtolerance", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  return(arkResVtolerance(ark_mem, rabstol));
}